

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::moveEvent(QMdiSubWindow *this,QMoveEvent *moveEvent)

{
  QObject *pQVar1;
  QMdiSubWindowPrivate *pQVar2;
  QMoveEvent *in_RSI;
  QWidget *in_RDI;
  WindowState unaff_retaddr;
  QMdiSubWindowPrivate *in_stack_00000008;
  QMdiSubWindowPrivate *d;
  
  pQVar1 = QObject::parent((QObject *)0x635991);
  if (pQVar1 == (QObject *)0x0) {
    QWidget::moveEvent(in_RDI,in_RSI);
  }
  else {
    pQVar2 = d_func((QMdiSubWindow *)0x6359b2);
    if ((pQVar2->isMaximizeMode & 1U) != 0) {
      QMdiSubWindowPrivate::ensureWindowState(in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void QMdiSubWindow::moveEvent(QMoveEvent *moveEvent)
{
    if (!parent()) {
        QWidget::moveEvent(moveEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->isMaximizeMode)
        d->ensureWindowState(Qt::WindowMaximized);
}